

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restincurl.h
# Opt level: O0

void __thiscall restincurl::Worker::WorkerThread::~WorkerThread(WorkerThread *this)

{
  bool bVar1;
  id __x;
  id __y;
  WorkerThread *this_local;
  
  __x = std::thread::get_id(&this->thread_);
  __y = std::this_thread::get_id();
  bVar1 = std::operator==(__x,__y);
  if (bVar1) {
    std::thread::detach();
  }
  std::thread::~thread(&this->thread_);
  return;
}

Assistant:

~WorkerThread() {
                if (thread_.get_id() == std::this_thread::get_id()) {
                    // Allow the thread to finish exiting the lambda
                    thread_.detach();
                }
            }